

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

Component __thiscall ftxui::Container::Horizontal(Container *this,Components *children)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  Components local_28;
  
  local_28.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (children->
       super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (children->
       super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (children->
       super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (children->
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (children->
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (children->
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Horizontal(this,&local_28,(int *)0x0);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_28);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Horizontal(Components children) {
  return Horizontal(std::move(children), nullptr);
}